

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * __thiscall
doctest::detail::stringifyBinaryExpr<jsonrpccxx::error_type,jsonrpccxx::error_type>
          (String *__return_storage_ptr__,detail *this,error_type *lhs,char *op,error_type *rhs)

{
  String local_98;
  String local_70;
  String local_58;
  String local_40;
  error_type *local_28;
  error_type *rhs_local;
  char *op_local;
  error_type *lhs_local;
  
  local_28 = (error_type *)op;
  rhs_local = lhs;
  op_local = (char *)this;
  lhs_local = (error_type *)__return_storage_ptr__;
  toString<jsonrpccxx::error_type,_true>(&local_58,(error_type *)this);
  String::String(&local_70,(char *)rhs_local);
  operator+(&local_40,&local_58,&local_70);
  toString<jsonrpccxx::error_type,_true>(&local_98,local_28);
  operator+(__return_storage_ptr__,&local_40,&local_98);
  String::~String(&local_98);
  String::~String(&local_40);
  String::~String(&local_70);
  String::~String(&local_58);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }